

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_configmanager.cpp
# Opt level: O2

void cali::internal::init_builtin_configmanager(Caliper *c)

{
  bool bVar1;
  bool allow;
  int iVar2;
  char *config_str;
  ostream *poVar3;
  undefined4 extraout_var;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  mapped_type *pmVar5;
  Events *pEVar6;
  __shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2> *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2b2;
  allocator_type local_2b1;
  ConfigManager mgr;
  Channel channel;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  services;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cfgmap;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [31];
  int local_28;
  
  config_str = getenv("CALI_CONFIG");
  if (config_str != (char *)0x0) {
    ConfigManager::ConfigManager(&mgr);
    ConfigManager::add(&mgr,config_str);
    bVar1 = ConfigManager::error(&mgr);
    if (bVar1) {
      std::ofstream::ofstream(local_228);
      local_28 = 0;
      poVar3 = Log::stream((Log *)local_228);
      poVar3 = std::operator<<(poVar3,"CALI_CONFIG: error: ");
      ConfigManager::error_msg_abi_cxx11_((string *)&cfgmap,&mgr);
      poVar3 = std::operator<<(poVar3,(string *)&cfgmap);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&cfgmap);
      std::ofstream::~ofstream(local_228);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_228,"cali.configmgr.flushed",(allocator<char> *)&cfgmap);
      iVar2 = (*(c->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface[4])
                        (c,local_228,7,0xc1,0,0,0);
      std::__cxx11::string::~string((string *)local_228);
      cali::services::get_available_services_abi_cxx11_();
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[9]>>
                        (services.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         services.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,"mpiflush");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[26],_const_char_(&)[6],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_228,(char (*) [26])"CALI_CHANNEL_CONFIG_CHECK",(char (*) [6])"false");
      __l._M_len = 1;
      __l._M_array = (iterator)local_228;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&cfgmap,__l,&local_2b2,&local_2b1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_228);
      if (_Var4._M_current !=
          services.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_228,"CALI_SERVICES_ENABLE",(allocator<char> *)&local_2b2);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&cfgmap,(key_type *)local_228);
        std::__cxx11::string::assign((char *)pmVar5);
        std::__cxx11::string::~string((string *)local_228);
      }
      RuntimeConfig::RuntimeConfig((RuntimeConfig *)local_228);
      RuntimeConfig::allow_read_env((RuntimeConfig *)local_228,allow);
      RuntimeConfig::import((RuntimeConfig *)local_228,&cfgmap);
      Caliper::create_channel((Caliper *)&channel,(char *)c,(RuntimeConfig *)"builtin.configmgr");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&cfgmap._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&services);
      ConfigManager::start(&mgr);
      pEVar6 = Channel::events(&channel);
      std::__shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                    *)local_228,
                   (__shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                    *)&mgr);
      local_248._M_unused._M_object = (void *)0x0;
      local_248._8_8_ = 0;
      local_238 = (code *)0x0;
      pcStack_230 = (code *)0x0;
      local_218[0]._0_8_ = (element_type *)CONCAT44(extraout_var,iVar2);
      this = (__shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2> *)
             operator_new(0x18);
      std::__shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(this,(__shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>
                         *)local_228);
      this[1]._M_ptr = (element_type *)local_218[0]._0_8_;
      pcStack_230 = std::
                    _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/builtin_configmanager.cpp:81:47)>
                    ::_M_invoke;
      local_238 = std::
                  _Function_handler<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/builtin_configmanager.cpp:81:47)>
                  ::_M_manager;
      local_248._M_unused._M_object = this;
      std::
      vector<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::ChannelBody_*,_cali::SnapshotView)>_>_>
      ::push_back(&(pEVar6->write_output_evt).mCb,(value_type *)&local_248);
      std::_Function_base::~_Function_base((_Function_base *)&local_248);
      ConfigManager::~ConfigManager((ConfigManager *)local_228);
      std::ofstream::ofstream(local_228);
      local_28 = 1;
      poVar3 = Log::stream((Log *)local_228);
      poVar3 = std::operator<<(poVar3,"Registered builtin ConfigManager");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ofstream::~ofstream(local_228);
      Channel::~Channel(&channel);
    }
    ConfigManager::~ConfigManager(&mgr);
  }
  return;
}

Assistant:

void init_builtin_configmanager(Caliper* c)
{
    const char* configstr = std::getenv("CALI_CONFIG");

    if (!configstr)
        return;

    ConfigManager mgr;
    mgr.add(configstr);

    if (mgr.error()) {
        Log(0).stream() << "CALI_CONFIG: error: " << mgr.error_msg() << std::endl;
        return;
    }

    //   Make a channel to trigger the ConfigManager flush. Use the mpiflush
    // service if it is available to trigger flushes at MPI_Finalize(). In
    // that case, set the configmgr.flushed attribute to skip flushing at the
    // end of the program.

    Attribute flag_attr = c->create_attribute(
        "cali.configmgr.flushed",
        CALI_TYPE_BOOL,
        CALI_ATTR_SKIP_EVENTS | CALI_ATTR_HIDDEN | CALI_ATTR_ASVALUE
    );

    Channel channel = ::make_flush_trigger_channel(c);

    mgr.start();

    channel.events().write_output_evt.connect([mgr, flag_attr](Caliper* c, ChannelBody* chB, SnapshotView) mutable {
        if (c->get(chB, flag_attr).value().to_bool() == true)
            return;

        mgr.flush();

        c->set(chB, flag_attr, Variant(true));
    });

    Log(1).stream() << "Registered builtin ConfigManager" << std::endl;
}